

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O1

void maxHeapify(double *heap_v,HighsInt *heap_i,HighsInt i,HighsInt n)

{
  double dVar1;
  double dVar2;
  HighsInt HVar3;
  int iVar4;
  
  dVar1 = heap_v[i];
  HVar3 = heap_i[i];
  iVar4 = i * 2;
  while (iVar4 <= n) {
    if ((iVar4 < n) &&
       (heap_v[iVar4] <= heap_v[(long)iVar4 + 1] && heap_v[(long)iVar4 + 1] != heap_v[iVar4])) {
      iVar4 = iVar4 + 1;
    }
    dVar2 = heap_v[iVar4];
    if (dVar2 < dVar1) break;
    if (dVar1 <= dVar2) {
      heap_v[iVar4 / 2] = dVar2;
      heap_i[iVar4 / 2] = heap_i[iVar4];
      iVar4 = iVar4 * 2;
    }
  }
  heap_v[iVar4 / 2] = dVar1;
  heap_i[iVar4 / 2] = HVar3;
  return;
}

Assistant:

void maxHeapify(double* heap_v, HighsInt* heap_i, HighsInt i, HighsInt n) {
  double temp_v;
  HighsInt j, temp_i;
  temp_v = heap_v[i];
  temp_i = heap_i[i];
  j = 2 * i;
  while (j <= n) {
    if (j < n && heap_v[j + 1] > heap_v[j]) j = j + 1;
    if (temp_v > heap_v[j])
      break;
    else if (temp_v <= heap_v[j]) {
      heap_v[j / 2] = heap_v[j];
      heap_i[j / 2] = heap_i[j];
      j = 2 * j;
    }
  }
  heap_v[j / 2] = temp_v;
  heap_i[j / 2] = temp_i;
  return;
}